

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool binomial_check(int a,double b)

{
  double b_local;
  int a_local;
  
  if (a < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BINOMIAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  A < 1.\n");
    b_local._7_1_ = false;
  }
  else if ((b < 0.0) || (1.0 < b)) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BINOMIAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  B < 0 or 1 < B.\n");
    b_local._7_1_ = false;
  }
  else {
    b_local._7_1_ = true;
  }
  return b_local._7_1_;
}

Assistant:

bool binomial_check ( int a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BINOMIAL_CHECK checks the parameter of the Binomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of trials.
//    1 <= A.
//
//    Input, double B, the probability of success on one trial.
//    0.0 <= B <= 1.0.
//
//    Output, bool BINOMIAL_CHECK, is true if the parameters are legal.
//
{
  if ( a < 1 )
  {
    cerr << "\n";
    cerr << "BINOMIAL_CHECK - Warning!\n";
    cerr << "  A < 1.\n";
    return false;
  }

  if ( b < 0.0 || 1.0 < b )
  {
    cerr << "\n";
    cerr << "BINOMIAL_CHECK - Warning!\n";
    cerr << "  B < 0 or 1 < B.\n";
    return false;
  }

  return true;
}